

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

bool anon_unknown.dwarf_127103f::IsFeatureSupported
               (cmMakefile *makefile,string *linkLanguage,string *feature)

{
  bool bVar1;
  cmValue local_148;
  cmAlphaNum local_140;
  cmAlphaNum local_110;
  string local_e0;
  undefined4 local_c0;
  cmValue local_b0;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string featureSupported;
  string *feature_local;
  string *linkLanguage_local;
  cmMakefile *makefile_local;
  
  featureSupported.field_2._8_8_ = feature;
  cmAlphaNum::cmAlphaNum(&local_78,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_a8,linkLanguage);
  cmStrCat<char[21],std::__cxx11::string,char[11]>
            ((string *)local_48,&local_78,&local_a8,(char (*) [21])0xc44c9b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             featureSupported.field_2._8_8_,(char (*) [11])0xc5640d);
  local_b0 = cmMakefile::GetDefinition(makefile,(string *)local_48);
  bVar1 = cmValue::IsOn(&local_b0);
  if (bVar1) {
    makefile_local._7_1_ = true;
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_110,"CMAKE_LINK_LIBRARY_USING_");
    cmAlphaNum::cmAlphaNum(&local_140,(string *)featureSupported.field_2._8_8_);
    cmStrCat<char[11]>(&local_e0,&local_110,&local_140,(char (*) [11])0xc5640d);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    local_148 = cmMakefile::GetDefinition(makefile,(string *)local_48);
    makefile_local._7_1_ = cmValue::IsOn(&local_148);
  }
  local_c0 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return makefile_local._7_1_;
}

Assistant:

bool IsFeatureSupported(cmMakefile* makefile, std::string const& linkLanguage,
                        std::string const& feature)
{
  auto featureSupported = cmStrCat(
    "CMAKE_", linkLanguage, "_LINK_LIBRARY_USING_", feature, "_SUPPORTED");
  if (makefile->GetDefinition(featureSupported).IsOn()) {
    return true;
  }

  featureSupported =
    cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature, "_SUPPORTED");
  return makefile->GetDefinition(featureSupported).IsOn();
}